

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O3

CURLcode Curl_req_abort_sending(Curl_easy *data)

{
  undefined1 *puVar1;
  int *piVar2;
  CURLcode CVar3;
  
  if (((data->req).field_0xd2 & 1) == 0) {
    Curl_bufq_reset(&(data->req).sendbuf);
    puVar1 = &(data->req).field_0xd2;
    *puVar1 = *puVar1 | 2;
    piVar2 = &(data->req).keepon;
    *(byte *)piVar2 = (byte)*piVar2 & 0xd5;
    CVar3 = req_set_upload_done(data);
    return CVar3;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_req_abort_sending(struct Curl_easy *data)
{
  if(!data->req.upload_done) {
    Curl_bufq_reset(&data->req.sendbuf);
    data->req.upload_aborted = TRUE;
    /* no longer KEEP_SEND and KEEP_SEND_PAUSE */
    data->req.keepon &= ~KEEP_SENDBITS;
    return req_set_upload_done(data);
  }
  return CURLE_OK;
}